

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_fneg(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 dst;
  TCGv_i64 ret;
  uintptr_t o;
  uintptr_t o_1;
  
  if (ctx->fpu_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    dst = tcg_temp_new_i64(tcg_ctx);
    ret = tcg_temp_new_i64(tcg_ctx);
    get_fpr(tcg_ctx,dst,ctx->opcode >> 0xb & 0x1f);
    tcg_gen_xori_i64_ppc64(tcg_ctx,ret,dst,-0x8000000000000000);
    set_fpr(tcg_ctx,ctx->opcode >> 0x15 & 0x1f,ret);
    if ((ctx->opcode & 1) != 0) {
      gen_set_cr1_from_fpscr(ctx);
    }
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,7);
  return;
}

Assistant:

static void gen_fneg(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;                                   \
    TCGv_i64 t0;
    TCGv_i64 t1;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    get_fpr(tcg_ctx, t0, rB(ctx->opcode));
    tcg_gen_xori_i64(tcg_ctx, t1, t0, 1ULL << 63);
    set_fpr(tcg_ctx, rD(ctx->opcode), t1);
    if (unlikely(Rc(ctx->opcode))) {
        gen_set_cr1_from_fpscr(ctx);
    }
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}